

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.cpp
# Opt level: O2

void __thiscall CShInstruction::Encode(CShInstruction *this)

{
  ushort data;
  ushort uVar1;
  uint uVar2;
  
  data = (this->opcodeData).opcode.base;
  switch((this->opcodeData).opcode.format) {
  case 1:
    uVar2 = (this->registerData).grt.num;
    goto LAB_00171b6c;
  case 2:
    uVar2 = (this->registerData).grs.num;
LAB_00171b6c:
    uVar1 = (ushort)((uVar2 & 0xf) << 8);
LAB_00171b72:
    data = data | uVar1;
    break;
  case 3:
    uVar1 = (ushort)(((this->registerData).grs.num & 0xfU) << 4) |
            (ushort)(((this->registerData).grt.num & 0xfU) << 8);
    goto LAB_00171b72;
  case 4:
    uVar2 = (this->registerData).grs.num;
    goto LAB_00171b52;
  case 5:
    uVar2 = (this->registerData).grt.num;
LAB_00171b52:
    uVar1 = (ushort)((uVar2 & 0xf) << 4);
LAB_00171b58:
    uVar1 = uVar1 | (ushort)(this->immediateData).primary.value;
    goto LAB_00171b72;
  case 6:
    data = data | (ushort)(((this->registerData).grs.num & 0xfU) << 4) |
           (ushort)(((this->registerData).grt.num & 0xfU) << 8) |
           (ushort)(this->immediateData).primary.value;
    break;
  case 7:
  case 8:
  case 10:
    data = data | (ushort)(this->immediateData).primary.value;
    break;
  case 9:
  case 0xb:
    uVar1 = (ushort)(((this->registerData).grt.num & 0xfU) << 8);
    goto LAB_00171b58;
  }
  FileManager::writeU16(g_fileManager,data);
  return;
}

Assistant:

void CShInstruction::Encode() const
{
	uint16_t encoding = opcodeData.opcode.base;

	switch (opcodeData.opcode.format)
	{
	case SHFMT_0:     // xxxx xxxx xxxx xxxx
		break;
	case SHFMT_N:     // xxxx nnnn xxxx xxxx
		encoding |= (registerData.grt.num & 0xF) << 8;
		break;
	case SHFMT_M:     // xxxx mmmm xxxx xxxx
		encoding |= (registerData.grs.num & 0xF) << 8;
		break;
	case SHFMT_NM:    // xxxx nnnn mmmm xxxx
		encoding |= (registerData.grt.num & 0xF) << 8;
		encoding |= (registerData.grs.num & 0xF) << 4;
		break;
	case SHFMT_MD:    // xxxx xxxx mmmm dddd
		encoding |= (registerData.grs.num & 0xF) << 4;
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_ND4:   // xxxx xxxx nnnn dddd
		encoding |= (registerData.grt.num & 0xF) << 4;
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_NMD:   // xxxx nnnn mmmm dddd
		encoding |= (registerData.grt.num & 0xF) << 8;
		encoding |= (registerData.grs.num & 0xF) << 4;
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_D:     // xxxx xxxx dddd dddd
	case SHFMT_D12:   // xxxx dddd dddd dddd
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_ND8:   // xxxx nnnn dddd dddd
		encoding |= (registerData.grt.num & 0xF) << 8;
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_I:     // xxxx xxxx iiii iiii
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_NI:    // xxxx nnnn iiii iiii
		encoding |= (registerData.grt.num & 0xF) << 8;
		encoding |= immediateData.primary.value;
		break;
	}

	g_fileManager->writeU16((uint16_t)encoding);
}